

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O3

Action __thiscall
psy::C::SyntaxDumper::visitConditionalExpression
          (SyntaxDumper *this,ConditionalExpressionSyntax *node)

{
  SyntaxToken local_50;
  
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->condExpr_);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->questionTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->whenTrueExpr_);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->colonTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->whenFalseExpr_);
  return Skip;
}

Assistant:

virtual Action visitConditionalExpression(const ConditionalExpressionSyntax* node) override
    {
        nonterminal(node->condition());
        terminal(node->questionToken(), node);
        nonterminal(node->whenTrue());
        terminal(node->colonToken(), node);
        nonterminal(node->whenFalse());
        return Action::Skip;
    }